

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

int32_t __thiscall icu_63::NFRule::indexOfAnyRulePrefix(NFRule *this)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -1;
  lVar5 = 0;
  do {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doIndexOf
                      (&this->fRuleText,**(UChar **)((long)&RULE_PREFIXES + lVar5),0,iVar3);
    iVar3 = iVar4;
    if (iVar2 < iVar4) {
      iVar3 = iVar2;
    }
    if (iVar4 == -1) {
      iVar3 = iVar2;
    }
    if (iVar2 != -1) {
      iVar4 = iVar3;
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  return iVar4;
}

Assistant:

int32_t
NFRule::indexOfAnyRulePrefix() const
{
    int result = -1;
    for (int i = 0; RULE_PREFIXES[i]; i++) {
        int32_t pos = fRuleText.indexOf(*RULE_PREFIXES[i]);
        if (pos != -1 && (result == -1 || pos < result)) {
            result = pos;
        }
    }
    return result;
}